

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nva.c
# Opt level: O0

int nva_init(void)

{
  uint32_t uVar1;
  nva_card *pnVar2;
  int i;
  nva_card c_2;
  pci_id_match nv01_match;
  nva_card c_1;
  pci_id_match nv_sgs_match;
  nva_card c;
  pci_device *dev;
  pci_device_iterator *it;
  pci_id_match nv_match;
  int ret;
  int local_dc;
  pci_device *local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  void *local_c0;
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  pci_device *local_98;
  undefined8 local_90;
  undefined8 local_88;
  void *local_80;
  undefined8 local_78;
  undefined8 local_70;
  undefined8 local_68;
  undefined8 local_60;
  pci_device *local_58;
  undefined8 local_50;
  undefined8 local_48;
  void *local_40;
  pci_device *local_38;
  long local_30;
  undefined8 local_28;
  undefined8 local_20;
  undefined8 local_18;
  undefined8 local_10;
  int local_8;
  int local_4;
  
  local_8 = pci_system_init();
  if (local_8 == 0) {
    local_28 = 0xffffffff000010de;
    local_20 = 0xffffffffffffffff;
    local_18 = 0xffff000000030000;
    local_10 = 0;
    local_30 = pci_id_match_iterator_create(&local_28);
    if (local_30 == 0) {
      pci_system_cleanup();
      local_4 = -1;
    }
    else {
      while (local_38 = (pci_device *)pci_device_next(local_30), local_38 != (pci_device *)0x0) {
        memset(&local_58,0,0x20);
        local_8 = pci_device_probe(local_38);
        if (local_8 == 0) {
          local_58 = local_38;
          if (nva_cardsmax <= nva_cardsnum) {
            if (nva_cardsmax == 0) {
              nva_cardsmax = 0x10;
            }
            else {
              nva_cardsmax = nva_cardsmax << 1;
            }
            nva_cards = (nva_card *)realloc(nva_cards,(long)nva_cardsmax << 5);
          }
          pnVar2 = nva_cards + nva_cardsnum;
          nva_cardsnum = nva_cardsnum + 1;
          pnVar2->pci = local_58;
          pnVar2->boot0 = (undefined4)local_50;
          pnVar2->chipset = local_50._4_4_;
          pnVar2->card_type = (undefined4)local_48;
          pnVar2->is_nv03p = local_48._4_4_;
          pnVar2->bar0 = local_40;
        }
        else {
          fprintf(_stderr,"WARN: Can\'t probe %04x:%02x:%02x.%x\n",(ulong)local_38->domain,
                  (ulong)local_38->bus,(ulong)local_38->dev,(ulong)local_38->func);
        }
      }
      pci_iterator_destroy(local_30);
      local_78 = 0xffffffff000012d2;
      local_70 = 0xffffffffffffffff;
      local_68 = 0xffff000000030000;
      local_60 = 0;
      local_30 = pci_id_match_iterator_create(&local_78);
      if (local_30 == 0) {
        pci_system_cleanup();
        local_4 = -1;
      }
      else {
        while (local_38 = (pci_device *)pci_device_next(local_30), local_38 != (pci_device *)0x0) {
          memset(&local_98,0,0x20);
          local_8 = pci_device_probe(local_38);
          if (local_8 == 0) {
            local_98 = local_38;
            if (nva_cardsmax <= nva_cardsnum) {
              if (nva_cardsmax == 0) {
                nva_cardsmax = 0x10;
              }
              else {
                nva_cardsmax = nva_cardsmax << 1;
              }
              nva_cards = (nva_card *)realloc(nva_cards,(long)nva_cardsmax << 5);
            }
            pnVar2 = nva_cards + nva_cardsnum;
            nva_cardsnum = nva_cardsnum + 1;
            pnVar2->pci = local_98;
            pnVar2->boot0 = (undefined4)local_90;
            pnVar2->chipset = local_90._4_4_;
            pnVar2->card_type = (undefined4)local_88;
            pnVar2->is_nv03p = local_88._4_4_;
            pnVar2->bar0 = local_80;
          }
          else {
            fprintf(_stderr,"WARN: Can\'t probe %04x:%02x:%02x.%x\n",(ulong)local_38->domain,
                    (ulong)local_38->bus,(ulong)local_38->dev,(ulong)local_38->func);
          }
        }
        pci_iterator_destroy(local_30);
        local_b8 = 0x90000104a;
        local_b0 = 0xffffffffffffffff;
        local_a8 = 0;
        local_a0 = 0;
        local_30 = pci_id_match_iterator_create(&local_b8);
        if (local_30 == 0) {
          pci_system_cleanup();
          local_4 = -1;
        }
        else {
          while (local_38 = (pci_device *)pci_device_next(local_30), local_38 != (pci_device *)0x0)
          {
            memset(&local_d8,0,0x20);
            local_8 = pci_device_probe(local_38);
            if (local_8 == 0) {
              local_d8 = local_38;
              if (nva_cardsmax <= nva_cardsnum) {
                if (nva_cardsmax == 0) {
                  nva_cardsmax = 0x10;
                }
                else {
                  nva_cardsmax = nva_cardsmax << 1;
                }
                nva_cards = (nva_card *)realloc(nva_cards,(long)nva_cardsmax << 5);
              }
              pnVar2 = nva_cards + nva_cardsnum;
              nva_cardsnum = nva_cardsnum + 1;
              pnVar2->pci = local_d8;
              pnVar2->boot0 = (undefined4)local_d0;
              pnVar2->chipset = local_d0._4_4_;
              pnVar2->card_type = (undefined4)local_c8;
              pnVar2->is_nv03p = local_c8._4_4_;
              pnVar2->bar0 = local_c0;
            }
            else {
              fprintf(_stderr,"WARN: Can\'t probe %04x:%02x:%02x.%x\n",(ulong)local_38->domain,
                      (ulong)local_38->bus,(ulong)local_38->dev,(ulong)local_38->func);
            }
          }
          pci_iterator_destroy(local_30);
          for (local_dc = 0; local_dc < nva_cardsnum; local_dc = local_dc + 1) {
            local_38 = nva_cards[local_dc].pci;
            local_8 = pci_device_map_range
                                (local_38,local_38->regions[0].base_addr,local_38->regions[0].size,1
                                 ,&nva_cards[local_dc].bar0);
            if (local_8 == 0) {
              uVar1 = nva_rd32(local_dc,0);
              nva_cards[local_dc].boot0 = uVar1;
              nva_cards[local_dc].chipset = nva_cards[local_dc].boot0 >> 0x14 & 0xff;
              if (nva_cards[local_dc].chipset < 0x10) {
                if ((nva_cards[local_dc].boot0 & 0xf000) == 0) {
                  nva_cards[local_dc].chipset = nva_cards[local_dc].boot0 >> 0x10 & 0xf;
                  if (0x1f < (nva_cards[local_dc].boot0 & 0xff)) {
                    nva_cards[local_dc].is_nv03p = 1;
                  }
                }
                else if ((nva_cards[local_dc].boot0 & 0xf00000) == 0) {
                  nva_cards[local_dc].chipset = 4;
                }
                else {
                  nva_cards[local_dc].chipset = 5;
                }
              }
              if ((local_38->vendor_id == 0x104a) && (local_38->device_id == 9)) {
                nva_cards[local_dc].chipset = 1;
              }
              if (nva_cards[local_dc].chipset < 4) {
                nva_cards[local_dc].card_type = nva_cards[local_dc].chipset;
              }
              else if (nva_cards[local_dc].chipset < 0x10) {
                nva_cards[local_dc].card_type = 4;
              }
              else if (nva_cards[local_dc].chipset < 0x20) {
                nva_cards[local_dc].card_type = 0x10;
              }
              else if (nva_cards[local_dc].chipset < 0x30) {
                nva_cards[local_dc].card_type = 0x20;
              }
              else if (nva_cards[local_dc].chipset < 0x40) {
                nva_cards[local_dc].card_type = 0x30;
              }
              else if ((nva_cards[local_dc].chipset < 0x50) ||
                      ((nva_cards[local_dc].chipset & 0xf0U) == 0x60)) {
                nva_cards[local_dc].card_type = 0x40;
              }
              else if (nva_cards[local_dc].chipset < 0xc0) {
                nva_cards[local_dc].card_type = 0x50;
              }
              else {
                nva_cards[local_dc].card_type = 0xc0;
              }
            }
            else {
              fprintf(_stderr,"WARN: Can\'t probe %04x:%02x:%02x.%x\n",(ulong)local_38->domain,
                      (ulong)local_38->bus,(ulong)local_38->dev,(ulong)local_38->func);
            }
          }
          local_4 = 0;
        }
      }
    }
  }
  else {
    local_4 = -1;
  }
  return local_4;
}

Assistant:

int nva_init() {
	int ret;
	ret = pci_system_init();
	if (ret)
		return -1;
	struct pci_id_match nv_match = {0x10de, PCI_MATCH_ANY, PCI_MATCH_ANY, PCI_MATCH_ANY, 0x30000, 0xffff0000};
	struct pci_device_iterator* it = pci_id_match_iterator_create(&nv_match);
	if (!it) {
		pci_system_cleanup();
		return -1;
	}

	struct pci_device *dev;
	while ((dev = pci_device_next(it))) {
		struct nva_card c = { 0 };
		ret = pci_device_probe(dev);
		if (ret) {
			fprintf (stderr, "WARN: Can't probe %04x:%02x:%02x.%x\n", dev->domain, dev->bus, dev->dev, dev->func);
			continue;
		}
		c.pci = dev;
		ADDARRAY(nva_cards, c);
	}
	pci_iterator_destroy(it);

	struct pci_id_match nv_sgs_match = {0x12d2, PCI_MATCH_ANY, PCI_MATCH_ANY, PCI_MATCH_ANY, 0x30000, 0xffff0000};
	it = pci_id_match_iterator_create(&nv_sgs_match);
	if (!it) {
		pci_system_cleanup();
		return -1;
	}

	while ((dev = pci_device_next(it))) {
		struct nva_card c = { 0 };
		ret = pci_device_probe(dev);
		if (ret) {
			fprintf (stderr, "WARN: Can't probe %04x:%02x:%02x.%x\n", dev->domain, dev->bus, dev->dev, dev->func);
			continue;
		}
		c.pci = dev;
		ADDARRAY(nva_cards, c);
	}
	pci_iterator_destroy(it);

	struct pci_id_match nv01_match = {0x104a, 0x0009, PCI_MATCH_ANY, PCI_MATCH_ANY, 0, 0};
	it = pci_id_match_iterator_create(&nv01_match);
	if (!it) {
		pci_system_cleanup();
		return -1;
	}

	while ((dev = pci_device_next(it))) {
		struct nva_card c = { 0 };
		ret = pci_device_probe(dev);
		if (ret) {
			fprintf (stderr, "WARN: Can't probe %04x:%02x:%02x.%x\n", dev->domain, dev->bus, dev->dev, dev->func);
			continue;
		}
		c.pci = dev;
		ADDARRAY(nva_cards, c);
	}
	pci_iterator_destroy(it);

	int i;
	for (i = 0; i < nva_cardsnum; i++) {
		dev = nva_cards[i].pci;
		ret = pci_device_map_range(dev, dev->regions[0].base_addr, dev->regions[0].size, PCI_DEV_MAP_FLAG_WRITABLE, &nva_cards[i].bar0);
		if (ret) {
			fprintf (stderr, "WARN: Can't probe %04x:%02x:%02x.%x\n", dev->domain, dev->bus, dev->dev, dev->func);
			continue;
		}
		nva_cards[i].boot0 = nva_rd32(i, 0);
		nva_cards[i].chipset = nva_cards[i].boot0 >> 20 & 0xff;
		if (nva_cards[i].chipset < 0x10) {
			if (nva_cards[i].boot0 & 0xf000) {
				if (nva_cards[i].boot0 & 0xf00000)
					nva_cards[i].chipset = 5;
				else
					nva_cards[i].chipset = 4;
			} else {
				nva_cards[i].chipset = nva_cards[i].boot0 >> 16 & 0xf;
				if ((nva_cards[i].boot0 & 0xff) >= 0x20)
					nva_cards[i].is_nv03p = 1;
			}
		}
		if (dev->vendor_id == 0x104a && dev->device_id == 0x0009)
			nva_cards[i].chipset = 0x01;

		if (nva_cards[i].chipset < 0x04)
			nva_cards[i].card_type = nva_cards[i].chipset;
		else if (nva_cards[i].chipset < 0x10)
			nva_cards[i].card_type = 0x04;
		else if (nva_cards[i].chipset < 0x20)
			nva_cards[i].card_type = 0x10;
		else if (nva_cards[i].chipset < 0x30)
			nva_cards[i].card_type = 0x20;
		else if (nva_cards[i].chipset < 0x40)
			nva_cards[i].card_type = 0x30;
		else if (nva_cards[i].chipset < 0x50 ||
			(nva_cards[i].chipset & 0xf0) == 0x60)
			nva_cards[i].card_type = 0x40;
		else if (nva_cards[i].chipset < 0xc0)
			nva_cards[i].card_type = 0x50;
		else
			nva_cards[i].card_type = 0xc0;
	}
	return 0;
}